

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O3

MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
Parser::parse(MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *__return_storage_ptr__,Parser *this,string *input)

{
  SQLStateMachine *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  bool bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar7;
  runtime_error *prVar8;
  string _token_string;
  string key;
  string token_string;
  Token t;
  string local_c0;
  Token local_a0;
  string local_78;
  Token local_58;
  
  BPlusTree<MultiMap::Pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::BPlusTree(&__return_storage_ptr__->tree,true);
  set_string(this,input);
  this_00 = &this->sql_state;
  SQLStateMachine::reset_state(this_00);
  if ((this->tokens)._size != 0) {
    paVar1 = &local_a0._token.field_2;
    do {
      Queue<string_tokenizer::Token>::pop(&local_58,&this->tokens);
      while ((this->tokens)._size != 0) {
        local_a0._token._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_a0,local_58._token._M_dataplus._M_p,
                   local_58._token._M_dataplus._M_p + local_58._token._M_string_length);
        _Var2._M_p = local_a0._token._M_dataplus._M_p;
        iVar4 = isspace((int)*local_a0._token._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != paVar1) {
          operator_delete(_Var2._M_p);
        }
        if (iVar4 == 0) break;
        Queue<string_tokenizer::Token>::pop(&local_a0,&this->tokens);
        std::__cxx11::string::operator=((string *)&local_58,(string *)&local_a0);
        local_58._type = local_a0._type;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._token._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._token._M_dataplus._M_p);
        }
      }
      local_a0._token._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,local_58._token._M_dataplus._M_p,
                 local_58._token._M_dataplus._M_p + local_58._token._M_string_length);
      _Var2._M_p = local_a0._token._M_dataplus._M_p;
      iVar4 = isspace((int)*local_a0._token._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var2._M_p != paVar1) {
        operator_delete(_Var2._M_p);
      }
      if (iVar4 == 0) {
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,local_58._token._M_dataplus._M_p,
                   local_58._token._M_dataplus._M_p + local_58._token._M_string_length);
        iVar5 = SQLStateMachine::update_state(this_00,&local_78);
        bVar3 = SQLStateMachine::is_quote_state(this_00,iVar5);
        if (bVar3) {
          std::__cxx11::string::_M_replace
                    ((ulong)&local_78,0,(char *)local_78._M_string_length,0x11b12f);
          while ((this->tokens)._size != 0) {
            bVar3 = SQLStateMachine::is_quote_state(this_00,iVar5);
            if (!bVar3) break;
            Queue<string_tokenizer::Token>::pop(&local_a0,&this->tokens);
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_c0,local_a0._token._M_dataplus._M_p,
                       local_a0._token._M_dataplus._M_p + local_a0._token._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_a0._token._M_dataplus._M_p != paVar1) {
              operator_delete(local_a0._token._M_dataplus._M_p);
            }
            iVar5 = SQLStateMachine::update_state(this_00,&local_c0);
            iVar6 = std::__cxx11::string::compare((char *)&local_c0);
            if (iVar6 != 0) {
              std::__cxx11::string::_M_append((char *)&local_78,(ulong)local_c0._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
          }
          bVar3 = SQLStateMachine::is_quote_state(this_00,iVar5);
          if (bVar3) {
            prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
            std::runtime_error::runtime_error(prVar8,this->NO_CLOSING_QUOTE);
            __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
          }
        }
        bVar3 = SQLStateMachine::is_invalid(this_00);
        if (bVar3) {
          prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::operator+(&local_a0._token,this->UNEXPECTED_TOKEN,&local_78);
          std::runtime_error::runtime_error(prVar8,(string *)&local_a0);
          __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        SQLStateMachine::get_parse_key_abi_cxx11_(&local_a0._token,this_00,iVar5);
        iVar5 = std::__cxx11::string::compare((char *)&local_a0);
        if (iVar5 != 0) {
          iVar5 = std::__cxx11::string::compare((char *)&local_a0);
          if (iVar5 == 0) {
            string_util::uppercase(&local_c0,&local_78);
            pvVar7 = MultiMap::
                     MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::at(__return_storage_ptr__,&local_a0._token);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pvVar7,&local_c0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
              operator_delete(local_c0._M_dataplus._M_p);
            }
          }
          else {
            pvVar7 = MultiMap::
                     MultiMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::at(__return_storage_ptr__,&local_a0._token);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(pvVar7,&local_78);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._token._M_dataplus._M_p != paVar1) {
          operator_delete(local_a0._token._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_58._token._M_dataplus._M_p != &local_58._token.field_2) {
        operator_delete(local_58._token._M_dataplus._M_p);
      }
    } while ((iVar4 == 0) && ((this->tokens)._size != 0));
  }
  bVar3 = SQLStateMachine::is_invalid(this_00);
  if (!bVar3) {
    bVar3 = SQLStateMachine::is_success(this_00);
    if (bVar3) {
      return __return_storage_ptr__;
    }
  }
  prVar8 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar8,this->END_OF_INPUT);
  __cxa_throw(prVar8,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

MultiMap::MultiMap<std::string, std::string> Parser::parse(const std::string& input) {
    MultiMap::MultiMap<std::string, std::string> parse_tree;
    set_string(input);
    sql_state.reset_state();
    int last_state = sql_state.get_state();
    while (!tokens.empty()) {
        string_tokenizer::Token t = tokens.pop();

        while (!tokens.empty() && isspace(t.token_str()[0])) {
            t = tokens.pop();
        }
        // we somehow exited the while loop with spaces, it's probably not
        // supposed to be there
        if (isspace(t.token_str()[0]))
            break;

        std::string token_string = t.token_str();
        last_state = sql_state.update_state(token_string);

        if (sql_state.is_quote_state(last_state)) {
            token_string = "";
            while (!tokens.empty() && sql_state.is_quote_state(last_state)) {
                std::string _token_string = tokens.pop().token_str();
                last_state = sql_state.update_state(_token_string);
                if (_token_string != "\"")
                    token_string += _token_string;
            }
            // we exited this loop while never finding a closing quote
            if (sql_state.is_quote_state(last_state))
                throw std::runtime_error(NO_CLOSING_QUOTE);
        }


        if (sql_state.is_invalid())
            throw std::runtime_error(UNEXPECTED_TOKEN + token_string);
        else {
            std::string key = sql_state.get_parse_key(last_state);
            if (key != "") {
                if (key == "command")
                    parse_tree[key] += string_util::uppercase(token_string);
                else
                    parse_tree[key] += token_string;
            }
        }
    }
    if (sql_state.is_invalid() || !sql_state.is_success()) {
        throw std::runtime_error(END_OF_INPUT);
    }
    #ifdef DEBUG
        std::cout << parse_tree << std::endl;
    #endif
    return parse_tree;
}